

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-list.c
# Opt level: O2

void object_list_free(object_list_t *list)

{
  if (list != (object_list_t *)0x0) {
    if (list->entries != (object_list_entry_t *)0x0) {
      mem_free(list->entries);
      list->entries = (object_list_entry_t *)0x0;
    }
    mem_free(list);
    return;
  }
  return;
}

Assistant:

void object_list_free(object_list_t *list)
{
	if (list == NULL)
		return;

	if (list->entries != NULL) {
		mem_free(list->entries);
		list->entries = NULL;
	}

	mem_free(list);
}